

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Slice_x86_avx::forward
          (Slice_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int _elempack;
  Mat *src;
  ulong _elemsize;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  size_t i;
  ulong uVar15;
  pointer pMVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  size_t i_1;
  long lVar20;
  void *pvVar21;
  long lVar22;
  undefined4 *puVar23;
  undefined4 *puVar24;
  pointer pMVar25;
  long lVar26;
  ulong uVar27;
  undefined4 *puVar28;
  undefined4 *puVar29;
  undefined4 *puVar30;
  undefined4 *puVar31;
  undefined4 *puVar32;
  int *piVar33;
  size_t i_3;
  long lVar34;
  int iVar35;
  size_t i_8;
  size_t i_2;
  long lVar36;
  undefined4 *puVar37;
  bool bVar38;
  undefined1 local_c8 [56];
  int local_90;
  size_t local_88;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar1 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar4 = (ulong)_elempack;
  lVar17 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86_avx[-3]);
  iVar10 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86_avx[-3]);
  if (uVar1 == 1) {
    iVar19 = src->w;
    lVar36 = 0;
    lVar34 = 0;
    uVar15 = 0;
    iVar35 = 0;
    while( true ) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar16) / 0x48;
      if (uVar5 <= uVar15) break;
      uVar9 = *(uint *)(lVar17 + uVar15 * 4);
      uVar6 = (ulong)uVar9;
      if (uVar9 == 0xffffff17) {
        uVar6 = (ulong)(long)(iVar19 * _elempack - iVar35) / (uVar5 + lVar36);
      }
      uVar9 = 1;
      if ((opt->use_packing_layout == true) &&
         (uVar9 = (uint)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
        uVar9 = 8;
      }
      Mat::create((Mat *)((long)&pMVar16->data + lVar34),
                  (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                       (long)(int)uVar9),(ulong)uVar9 * (_elemsize / uVar4),uVar9,
                  opt->blob_allocator);
      pvVar21 = *(void **)((long)&pMVar16->data + lVar34);
      if (pvVar21 == (void *)0x0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar16->c + lVar34) * *(long *)((long)&pMVar16->cstep + lVar34) ==
          0) {
        return -100;
      }
      memcpy(pvVar21,(void *)((long)iVar35 * 4 + (long)src->data),
             (long)*(int *)((long)&pMVar16->w + lVar34) *
             *(long *)((long)&pMVar16->elemsize + lVar34));
      iVar35 = (int)uVar6 + iVar35;
      uVar15 = uVar15 + 1;
      lVar34 = lVar34 + 0x48;
      lVar36 = lVar36 + -1;
    }
  }
  iVar10 = (iVar10 >> 0x1f & uVar1) + iVar10;
  if ((uVar1 == 2) && (iVar10 == 0)) {
    local_78 = (ulong)src->w;
    iVar19 = src->h;
    lVar36 = 0;
    lVar34 = 0;
    uVar15 = 0;
    iVar35 = 0;
    while( true ) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar16) / 0x48;
      if (uVar5 <= uVar15) break;
      uVar9 = *(uint *)(lVar17 + uVar15 * 4);
      uVar6 = (ulong)uVar9;
      if (uVar9 == 0xffffff17) {
        uVar6 = (ulong)(long)(iVar19 * _elempack - iVar35) / (uVar5 + lVar36);
      }
      lVar12 = 1;
      if ((opt->use_packing_layout == true) &&
         (lVar12 = (ulong)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
        lVar12 = 8;
      }
      Mat::create((Mat *)((long)&pMVar16->data + lVar34),(int)local_78,
                  (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                       (long)(int)lVar12),lVar12 * (_elemsize / uVar4),(int)lVar12,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar16->data + lVar34) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar16->c + lVar34) * *(long *)((long)&pMVar16->cstep + lVar34) ==
          0) {
        return -100;
      }
      iVar35 = (int)uVar6 + iVar35;
      uVar15 = uVar15 + 1;
      lVar34 = lVar34 + 0x48;
      lVar36 = lVar36 + -1;
    }
    iVar19 = pMVar16->elempack;
    piVar33 = &pMVar16->elempack;
    while (bVar38 = uVar5 != 0, uVar5 = uVar5 - 1, bVar38) {
      if (*piVar33 < iVar19) {
        iVar19 = *piVar33;
      }
      piVar33 = piVar33 + 0x12;
    }
    piVar33 = src->refcount;
    local_c8._0_8_ = src->data;
    local_c8._8_8_ = src->refcount;
    local_c8._16_8_ = src->elemsize;
    local_c8._24_4_ = src->elempack;
    local_c8._32_8_ = src->allocator;
    local_c8._40_4_ = src->dims;
    local_c8._44_4_ = src->w;
    local_c8._48_4_ = src->h;
    local_c8._52_4_ = src->d;
    local_90 = src->c;
    local_88 = src->cstep;
    if (piVar33 != (int *)0x0) {
      LOCK();
      *piVar33 = *piVar33 + 1;
      UNLOCK();
    }
    if (iVar19 < _elempack) {
      convert_packing(src,(Mat *)local_c8,iVar19,opt);
    }
    uVar15 = local_78;
    iVar35 = (int)local_78;
    lVar34 = (long)(iVar35 * 4);
    lVar36 = (long)(iVar35 * 8);
    uVar5 = 0;
    if (0 < iVar35) {
      uVar5 = local_78 & 0xffffffff;
    }
    local_58 = lVar34 * 4;
    local_60 = lVar34 * 4 + 0xc;
    lVar12 = lVar36 * 4;
    local_50 = (long)(iVar35 * 7) << 2;
    local_48 = (long)(iVar35 * 6) << 2;
    local_40 = (long)(iVar35 * 5) << 2;
    puVar24 = (undefined4 *)local_c8._0_8_;
    local_68 = lVar34;
    for (uVar6 = 0;
        pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar6 < (ulong)(((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar16) / 0x48);
        uVar6 = uVar6 + 1) {
      pMVar25 = pMVar16 + uVar6;
      iVar14 = pMVar16[uVar6].elempack;
      if ((iVar19 == 4) && (iVar14 == 8)) {
        uVar7 = (ulong)(uint)pMVar25->h;
        if (pMVar25->h < 1) {
          uVar7 = 0;
        }
        lVar11 = local_60 + (long)puVar24;
        for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
          lVar22 = pMVar25->elemsize * uVar13 * (long)pMVar25->w;
          pvVar21 = pMVar25->data;
          lVar26 = 0;
          uVar27 = uVar5;
          while (iVar14 = (int)uVar27, uVar27 = (ulong)(iVar14 - 1), iVar14 != 0) {
            *(undefined4 *)((long)pvVar21 + lVar26 * 2 + lVar22) =
                 *(undefined4 *)((long)puVar24 + lVar26);
            *(undefined4 *)((long)pvVar21 + lVar26 * 2 + lVar22 + 4) =
                 *(undefined4 *)((long)puVar24 + lVar26 + 4);
            *(undefined4 *)((long)pvVar21 + lVar26 * 2 + lVar22 + 8) =
                 *(undefined4 *)((long)puVar24 + lVar26 + 8);
            *(undefined4 *)((long)pvVar21 + lVar26 * 2 + lVar22 + 0xc) =
                 *(undefined4 *)((long)puVar24 + lVar26 + 0xc);
            *(undefined4 *)((long)pvVar21 + lVar26 * 2 + lVar22 + 0x10) =
                 *(undefined4 *)(lVar11 + -0xc + lVar26);
            *(undefined4 *)((long)pvVar21 + lVar26 * 2 + lVar22 + 0x14) =
                 *(undefined4 *)(lVar11 + -8 + lVar26);
            *(undefined4 *)((long)pvVar21 + lVar26 * 2 + lVar22 + 0x18) =
                 *(undefined4 *)(lVar11 + -4 + lVar26);
            *(undefined4 *)((long)pvVar21 + lVar26 * 2 + lVar22 + 0x1c) =
                 *(undefined4 *)(lVar11 + lVar26);
            lVar26 = lVar26 + 0x10;
          }
          puVar24 = puVar24 + lVar36;
          lVar11 = lVar11 + lVar12;
        }
        iVar14 = pMVar25->elempack;
      }
      if ((iVar19 == 1) && (iVar14 == 8)) {
        uVar9 = pMVar25->h;
        if (pMVar25->h < 1) {
          uVar9 = 0;
        }
        local_70 = (ulong)uVar9;
        lVar34 = (long)puVar24 + local_50;
        lVar11 = (long)puVar24 + local_48;
        lVar22 = (long)puVar24 + local_40;
        lVar26 = (long)puVar24 + local_58;
        puVar28 = puVar24 + iVar35 * 3;
        puVar23 = puVar24 + iVar35 * 2;
        puVar29 = puVar24 + uVar15;
        for (uVar7 = 0; uVar7 != local_70; uVar7 = uVar7 + 1) {
          lVar8 = pMVar25->elemsize * uVar7 * (long)pMVar25->w;
          pvVar21 = pMVar25->data;
          lVar20 = 0;
          iVar14 = (int)uVar5;
          while (bVar38 = iVar14 != 0, iVar14 = iVar14 + -1, bVar38) {
            *(undefined4 *)((long)pvVar21 + lVar20 * 8 + lVar8) =
                 *(undefined4 *)((long)puVar24 + lVar20);
            *(undefined4 *)((long)pvVar21 + lVar20 * 8 + lVar8 + 4) =
                 *(undefined4 *)((long)puVar29 + lVar20);
            *(undefined4 *)((long)pvVar21 + lVar20 * 8 + lVar8 + 8) =
                 *(undefined4 *)((long)puVar23 + lVar20);
            *(undefined4 *)((long)pvVar21 + lVar20 * 8 + lVar8 + 0xc) =
                 *(undefined4 *)((long)puVar28 + lVar20);
            *(undefined4 *)((long)pvVar21 + lVar20 * 8 + lVar8 + 0x10) =
                 *(undefined4 *)(lVar26 + lVar20);
            *(undefined4 *)((long)pvVar21 + lVar20 * 8 + lVar8 + 0x14) =
                 *(undefined4 *)(lVar22 + lVar20);
            *(undefined4 *)((long)pvVar21 + lVar20 * 8 + lVar8 + 0x18) =
                 *(undefined4 *)(lVar11 + lVar20);
            *(undefined4 *)((long)pvVar21 + lVar20 * 8 + lVar8 + 0x1c) =
                 *(undefined4 *)(lVar34 + lVar20);
            lVar20 = lVar20 + 4;
          }
          puVar24 = puVar24 + lVar36;
          lVar34 = lVar34 + lVar12;
          lVar11 = lVar11 + lVar12;
          lVar22 = lVar22 + lVar12;
          lVar26 = lVar26 + lVar12;
          puVar28 = puVar28 + lVar36;
          puVar23 = puVar23 + lVar36;
          puVar29 = puVar29 + lVar36;
        }
        iVar14 = pMVar25->elempack;
        lVar34 = local_68;
        local_38 = uVar6;
      }
      if ((iVar19 == 1) && (iVar14 == 4)) {
        uVar7 = (ulong)(uint)pMVar25->h;
        if (pMVar25->h < 1) {
          uVar7 = 0;
        }
        for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
          puVar23 = (undefined4 *)
                    ((long)pMVar25->w * uVar13 * pMVar25->elemsize + (long)pMVar25->data);
          uVar27 = uVar5;
          puVar28 = puVar24;
          while (iVar18 = (int)uVar27, uVar27 = (ulong)(iVar18 - 1), iVar18 != 0) {
            *puVar23 = *puVar28;
            puVar23[1] = puVar28[uVar15];
            puVar23[2] = puVar28[iVar35 * 2];
            puVar29 = puVar28 + iVar35 * 3;
            puVar28 = puVar28 + 1;
            puVar23[3] = *puVar29;
            puVar23 = puVar23 + 4;
          }
          puVar24 = puVar24 + lVar34;
        }
      }
      if (iVar19 == iVar14) {
        lVar34 = (long)pMVar25->h * local_78;
        memcpy(pMVar25->data,puVar24,pMVar25->elemsize * lVar34);
        puVar24 = puVar24 + (long)(int)lVar34 * (long)pMVar25->elempack;
        lVar34 = local_68;
      }
    }
    if ((int *)local_c8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_c8._8_8_ = *(int *)local_c8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_c8._8_8_ == 0) {
        if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
          free((void *)local_c8._0_8_);
        }
        else {
          (*(*(_func_int ***)local_c8._32_8_)[3])();
        }
      }
    }
  }
  if ((uVar1 == 2) && (iVar10 == 1)) {
    iVar19 = src->w;
    uVar9 = src->h;
    lVar34 = 0;
    lVar36 = 0;
    iVar35 = 0;
    uVar15 = 0;
    while( true ) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar5 = ((long)pMVar25 - (long)pMVar16) / 0x48;
      if (uVar5 <= uVar15) break;
      iVar14 = *(int *)(lVar17 + uVar15 * 4);
      if (iVar14 == -0xe9) {
        iVar14 = (int)((ulong)((long)iVar19 - (long)iVar35) / (uVar5 + lVar34));
      }
      Mat::create((Mat *)((long)&pMVar16->data + lVar36),iVar14,uVar9,_elemsize,_elempack,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar16->data + lVar36) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar16->c + lVar36) * *(long *)((long)&pMVar16->cstep + lVar36) ==
          0) {
        return -100;
      }
      iVar35 = iVar14 + iVar35;
      uVar15 = uVar15 + 1;
      lVar36 = lVar36 + 0x48;
      lVar34 = lVar34 + -1;
    }
    uVar5 = 0;
    uVar15 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar15 = uVar5;
    }
    for (; uVar5 != uVar15; uVar5 = uVar5 + 1) {
      pvVar21 = (void *)((long)src->w * uVar5 * src->elemsize + (long)src->data);
      lVar34 = 0x2c;
      for (uVar6 = 0; uVar6 < (ulong)(((long)pMVar25 - (long)pMVar16) / 0x48); uVar6 = uVar6 + 1) {
        lVar36 = (long)*(int *)((long)&pMVar16->data + lVar34);
        memcpy((void *)(uVar5 * lVar36 * *(long *)((long)pMVar16 + lVar34 + -0x1c) +
                       *(long *)((long)pMVar16 + lVar34 + -0x2c)),pvVar21,lVar36 * _elemsize);
        pvVar21 = (void *)((long)pvVar21 + (long)*(int *)((long)&pMVar16->data + lVar34) * uVar4 * 4
                          );
        pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar34 = lVar34 + 0x48;
      }
    }
  }
  if ((uVar1 == 3) && (iVar10 == 0)) {
    iVar19 = src->w;
    iVar35 = src->h;
    iVar14 = src->c;
    lVar36 = 0;
    lVar34 = 0;
    iVar18 = 0;
    uVar15 = 0;
    while( true ) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar16) / 0x48;
      if (uVar5 <= uVar15) break;
      uVar9 = *(uint *)(lVar17 + uVar15 * 4);
      uVar6 = (ulong)uVar9;
      if (uVar9 == 0xffffff17) {
        uVar6 = (ulong)(long)(iVar14 * _elempack - iVar18) / (uVar5 + lVar36);
      }
      lVar12 = 1;
      if ((opt->use_packing_layout == true) &&
         (lVar12 = (ulong)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
        lVar12 = 8;
      }
      Mat::create((Mat *)((long)&pMVar16->data + lVar34),iVar19,iVar35,
                  (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                       (long)(int)lVar12),lVar12 * (_elemsize / uVar4),(int)lVar12,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar16->data + lVar34) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar16->c + lVar34) * *(long *)((long)&pMVar16->cstep + lVar34) ==
          0) {
        return -100;
      }
      iVar18 = (int)uVar6 + iVar18;
      uVar15 = uVar15 + 1;
      lVar34 = lVar34 + 0x48;
      lVar36 = lVar36 + -1;
    }
    iVar19 = pMVar16->elempack;
    piVar33 = &pMVar16->elempack;
    while (bVar38 = uVar5 != 0, uVar5 = uVar5 - 1, bVar38) {
      if (*piVar33 < iVar19) {
        iVar19 = *piVar33;
      }
      piVar33 = piVar33 + 0x12;
    }
    piVar33 = src->refcount;
    local_c8._0_8_ = src->data;
    local_c8._8_8_ = src->refcount;
    local_c8._16_8_ = src->elemsize;
    local_c8._24_4_ = src->elempack;
    local_c8._32_8_ = src->allocator;
    local_c8._40_4_ = src->dims;
    local_c8._44_4_ = src->w;
    local_c8._48_4_ = src->h;
    local_c8._52_4_ = src->d;
    local_90 = src->c;
    local_88 = src->cstep;
    if (piVar33 != (int *)0x0) {
      LOCK();
      *piVar33 = *piVar33 + 1;
      UNLOCK();
    }
    if (iVar19 < _elempack) {
      convert_packing(src,(Mat *)local_c8,iVar19,opt);
    }
    uVar5 = 0;
    uVar15 = 0;
    local_70 = CONCAT44(local_70._4_4_,iVar19);
    while( true ) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar34 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar16;
      if ((ulong)(lVar34 / 0x48) <= uVar15) break;
      pMVar25 = pMVar16 + uVar15;
      iVar35 = pMVar16[uVar15].elempack;
      if ((iVar19 == 4) && (iVar35 == 8)) {
        iVar35 = pMVar25->h * pMVar25->w;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        uVar5 = (ulong)(int)uVar5;
        uVar9 = pMVar25->c;
        if (pMVar25->c < 1) {
          uVar9 = 0;
        }
        lVar34 = local_88 * local_c8._16_8_;
        puVar28 = (undefined4 *)(lVar34 * uVar5 + local_c8._0_8_);
        puVar24 = (undefined4 *)((uVar5 + 1) * lVar34 + local_c8._0_8_);
        for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
          lVar36 = pMVar25->cstep * pMVar25->elemsize * uVar6;
          pvVar21 = pMVar25->data;
          lVar12 = 0;
          iVar14 = iVar35;
          while (bVar38 = iVar14 != 0, iVar14 = iVar14 + -1, bVar38) {
            *(undefined4 *)((long)pvVar21 + lVar12 * 2 + lVar36) =
                 *(undefined4 *)((long)puVar28 + lVar12);
            *(undefined4 *)((long)pvVar21 + lVar12 * 2 + lVar36 + 4) =
                 *(undefined4 *)((long)puVar28 + lVar12 + 4);
            *(undefined4 *)((long)pvVar21 + lVar12 * 2 + lVar36 + 8) =
                 *(undefined4 *)((long)puVar28 + lVar12 + 8);
            *(undefined4 *)((long)pvVar21 + lVar12 * 2 + lVar36 + 0xc) =
                 *(undefined4 *)((long)puVar28 + lVar12 + 0xc);
            *(undefined4 *)((long)pvVar21 + lVar12 * 2 + lVar36 + 0x10) =
                 *(undefined4 *)((long)puVar24 + lVar12);
            *(undefined4 *)((long)pvVar21 + lVar12 * 2 + lVar36 + 0x14) =
                 *(undefined4 *)((long)puVar24 + lVar12 + 4);
            *(undefined4 *)((long)pvVar21 + lVar12 * 2 + lVar36 + 0x18) =
                 *(undefined4 *)((long)puVar24 + lVar12 + 8);
            *(undefined4 *)((long)pvVar21 + lVar12 * 2 + lVar36 + 0x1c) =
                 *(undefined4 *)((long)puVar24 + lVar12 + 0xc);
            lVar12 = lVar12 + 0x10;
          }
          uVar5 = uVar5 + 2;
          puVar28 = (undefined4 *)((long)puVar28 + lVar34 * 2);
          puVar24 = (undefined4 *)((long)puVar24 + lVar34 * 2);
        }
        iVar35 = pMVar25->elempack;
      }
      if ((iVar19 == 1) && (iVar35 == 8)) {
        uVar9 = pMVar25->h * pMVar25->w;
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        uVar5 = (ulong)(int)uVar5;
        uVar2 = pMVar25->c;
        if (pMVar25->c < 1) {
          uVar2 = 0;
        }
        lVar34 = local_88 * local_c8._16_8_;
        puVar37 = (undefined4 *)(lVar34 * uVar5 + local_c8._0_8_);
        puVar28 = (undefined4 *)((uVar5 + 1) * lVar34 + local_c8._0_8_);
        puVar23 = (undefined4 *)((uVar5 + 2) * lVar34 + local_c8._0_8_);
        puVar29 = (undefined4 *)((uVar5 + 3) * lVar34 + local_c8._0_8_);
        puVar30 = (undefined4 *)((uVar5 + 4) * lVar34 + local_c8._0_8_);
        puVar31 = (undefined4 *)((uVar5 + 5) * lVar34 + local_c8._0_8_);
        puVar32 = (undefined4 *)((uVar5 + 6) * lVar34 + local_c8._0_8_);
        puVar24 = (undefined4 *)((uVar5 + 7) * lVar34 + local_c8._0_8_);
        for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
          lVar12 = pMVar25->cstep * pMVar25->elemsize * uVar6;
          pvVar21 = pMVar25->data;
          lVar36 = 0;
          uVar3 = uVar9;
          while (bVar38 = uVar3 != 0, uVar3 = uVar3 - 1, bVar38) {
            *(undefined4 *)((long)pvVar21 + lVar36 * 8 + lVar12) =
                 *(undefined4 *)((long)puVar37 + lVar36);
            *(undefined4 *)((long)pvVar21 + lVar36 * 8 + lVar12 + 4) =
                 *(undefined4 *)((long)puVar28 + lVar36);
            *(undefined4 *)((long)pvVar21 + lVar36 * 8 + lVar12 + 8) =
                 *(undefined4 *)((long)puVar23 + lVar36);
            *(undefined4 *)((long)pvVar21 + lVar36 * 8 + lVar12 + 0xc) =
                 *(undefined4 *)((long)puVar29 + lVar36);
            *(undefined4 *)((long)pvVar21 + lVar36 * 8 + lVar12 + 0x10) =
                 *(undefined4 *)((long)puVar30 + lVar36);
            *(undefined4 *)((long)pvVar21 + lVar36 * 8 + lVar12 + 0x14) =
                 *(undefined4 *)((long)puVar31 + lVar36);
            *(undefined4 *)((long)pvVar21 + lVar36 * 8 + lVar12 + 0x18) =
                 *(undefined4 *)((long)puVar32 + lVar36);
            *(undefined4 *)((long)pvVar21 + lVar36 * 8 + lVar12 + 0x1c) =
                 *(undefined4 *)((long)puVar24 + lVar36);
            lVar36 = lVar36 + 4;
          }
          uVar5 = uVar5 + 8;
          puVar37 = puVar37 + lVar34 * 2;
          puVar28 = puVar28 + lVar34 * 2;
          puVar23 = puVar23 + lVar34 * 2;
          puVar29 = puVar29 + lVar34 * 2;
          puVar30 = puVar30 + lVar34 * 2;
          puVar31 = puVar31 + lVar34 * 2;
          puVar32 = puVar32 + lVar34 * 2;
          puVar24 = puVar24 + lVar34 * 2;
        }
        iVar35 = pMVar25->elempack;
        iVar19 = (int)local_70;
      }
      if ((iVar19 == 1) && (iVar35 == 4)) {
        iVar14 = pMVar25->h * pMVar25->w;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        uVar5 = (ulong)(int)uVar5;
        uVar9 = pMVar25->c;
        if (pMVar25->c < 1) {
          uVar9 = 0;
        }
        lVar34 = local_88 * local_c8._16_8_;
        puVar29 = (undefined4 *)(lVar34 * uVar5 + local_c8._0_8_);
        puVar24 = (undefined4 *)((uVar5 + 1) * lVar34 + local_c8._0_8_);
        puVar28 = (undefined4 *)((uVar5 + 2) * lVar34 + local_c8._0_8_);
        puVar23 = (undefined4 *)((uVar5 + 3) * lVar34 + local_c8._0_8_);
        for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
          puVar30 = (undefined4 *)(pMVar25->cstep * uVar6 * pMVar25->elemsize + (long)pMVar25->data)
          ;
          for (lVar36 = 0; iVar14 != (int)lVar36; lVar36 = lVar36 + 1) {
            *puVar30 = puVar29[lVar36];
            puVar30[1] = puVar24[lVar36];
            puVar30[2] = puVar28[lVar36];
            puVar30[3] = puVar23[lVar36];
            puVar30 = puVar30 + 4;
          }
          uVar5 = uVar5 + 4;
          puVar29 = puVar29 + lVar34;
          puVar24 = puVar24 + lVar34;
          puVar28 = puVar28 + lVar34;
          puVar23 = puVar23 + lVar34;
        }
      }
      if (iVar19 == iVar35) {
        memcpy(pMVar25->data,
               (undefined4 *)(local_88 * (long)(int)uVar5 * local_c8._16_8_ + local_c8._0_8_),
               (long)((int)pMVar25->cstep * pMVar25->c) * pMVar25->elemsize);
        uVar5 = (ulong)(uint)((int)uVar5 + pMVar25->c);
      }
      uVar15 = uVar15 + 1;
    }
    if ((int *)local_c8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_c8._8_8_ = *(int *)local_c8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_c8._8_8_ == 0) {
        if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
          free((void *)local_c8._0_8_);
        }
        else {
          (*(*(_func_int ***)local_c8._32_8_)[3])(local_c8._32_8_,local_c8._0_8_,lVar34 % 0x48);
        }
      }
    }
  }
  if ((uVar1 == 3) && (iVar10 == 1)) {
    iVar19 = src->w;
    uVar9 = src->c;
    iVar35 = src->h;
    lVar34 = 0;
    lVar36 = 0;
    iVar14 = 0;
    uVar15 = 0;
    while( true ) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar5 = ((long)pMVar25 - (long)pMVar16) / 0x48;
      if (uVar5 <= uVar15) break;
      iVar18 = *(int *)(lVar17 + uVar15 * 4);
      if (iVar18 == -0xe9) {
        iVar18 = (int)((ulong)((long)iVar35 - (long)iVar14) / (uVar5 + lVar34));
      }
      Mat::create((Mat *)((long)&pMVar16->data + lVar36),iVar19,iVar18,uVar9,_elemsize,_elempack,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar16->data + lVar36) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar16->c + lVar36) * *(long *)((long)&pMVar16->cstep + lVar36) ==
          0) {
        return -100;
      }
      iVar14 = iVar18 + iVar14;
      uVar15 = uVar15 + 1;
      lVar36 = lVar36 + 0x48;
      lVar34 = lVar34 + -1;
    }
    uVar5 = 0;
    uVar15 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar15 = uVar5;
    }
    for (; uVar5 != uVar15; uVar5 = uVar5 + 1) {
      pvVar21 = (void *)(src->cstep * uVar5 * src->elemsize + (long)src->data);
      lVar34 = 0x40;
      for (uVar6 = 0; uVar6 < (ulong)(((long)pMVar25 - (long)pMVar16) / 0x48); uVar6 = uVar6 + 1) {
        lVar36 = (long)*(int *)((long)pMVar16 + lVar34 + -0x10) *
                 (long)*(int *)((long)pMVar16 + lVar34 + -0x14);
        memcpy((void *)(*(long *)((long)&pMVar16->data + lVar34) * uVar5 *
                        *(long *)((long)pMVar16 + lVar34 + -0x30) +
                       *(long *)((long)pMVar16 + lVar34 + -0x40)),pvVar21,lVar36 * _elemsize);
        pvVar21 = (void *)((long)pvVar21 + (long)((int)lVar36 * _elempack) * 4);
        pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar34 = lVar34 + 0x48;
      }
    }
  }
  if ((uVar1 == 3) && (iVar10 == 2)) {
    iVar10 = src->w;
    uVar1 = src->h;
    uVar9 = src->c;
    lVar36 = 0;
    lVar34 = 0;
    iVar19 = 0;
    uVar15 = 0;
    while( true ) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar5 = ((long)pMVar25 - (long)pMVar16) / 0x48;
      if (uVar5 <= uVar15) break;
      iVar35 = *(int *)(lVar17 + uVar15 * 4);
      if (iVar35 == -0xe9) {
        iVar35 = (int)((ulong)((long)iVar10 - (long)iVar19) / (uVar5 + lVar36));
      }
      Mat::create((Mat *)((long)&pMVar16->data + lVar34),iVar35,uVar1,uVar9,_elemsize,_elempack,
                  opt->blob_allocator);
      if ((*(long *)((long)&pMVar16->data + lVar34) == 0) ||
         ((long)*(int *)((long)&pMVar16->c + lVar34) * *(long *)((long)&pMVar16->cstep + lVar34) ==
          0)) {
        return -100;
      }
      iVar19 = iVar35 + iVar19;
      uVar15 = uVar15 + 1;
      lVar34 = lVar34 + 0x48;
      lVar36 = lVar36 + -1;
    }
    uVar15 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar15 = 0;
    }
    uVar5 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar5 = 0;
    }
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pvVar21 = (void *)(src->cstep * uVar6 * src->elemsize + (long)src->data);
      for (uVar7 = 0; uVar7 != uVar15; uVar7 = uVar7 + 1) {
        lVar17 = 0x40;
        for (uVar13 = 0; uVar13 < (ulong)(((long)pMVar25 - (long)pMVar16) / 0x48);
            uVar13 = uVar13 + 1) {
          lVar36 = (long)*(int *)((long)pMVar16 + lVar17 + -0x14);
          lVar34 = *(long *)((long)pMVar16 + lVar17 + -0x30);
          memcpy((void *)(uVar7 * lVar36 * lVar34 +
                         *(long *)((long)&pMVar16->data + lVar17) * uVar6 * lVar34 +
                         *(long *)((long)pMVar16 + lVar17 + -0x40)),pvVar21,lVar36 * _elemsize);
          pvVar21 = (void *)((long)pvVar21 +
                            (long)*(int *)((long)pMVar16 + lVar17 + -0x14) * uVar4 * 4);
          pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar17 = lVar17 + 0x48;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}